

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t archive_read_format_lha_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  lha *lha;
  archive_string_conv *paVar3;
  uint16_t uVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  uchar *p;
  char *pcVar8;
  void *pvVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  ushort *pp;
  short *pp_00;
  byte *pbVar13;
  int64_t iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ushort uVar18;
  mode_t mVar19;
  int iVar20;
  void *pvVar21;
  uint uVar22;
  byte bVar23;
  void *h;
  bool bVar24;
  uint16_t header_crc;
  wchar_t *conv_buffer_p;
  size_t extdsize;
  archive_wstring local_d8;
  archive_wstring local_b8;
  wchar_t *local_a0;
  archive_mstring local_98;
  
  if (lha_crc16_init_crc16init == '\0') {
    lha_crc16_init_crc16init = '\x01';
    uVar16 = 0;
    do {
      iVar20 = -8;
      uVar15 = uVar16 & 0xffffffff;
      do {
        uVar22 = 0;
        if ((uVar15 & 1) != 0) {
          uVar22 = 0xa001;
        }
        uVar22 = uVar22 ^ (uint)(uVar15 >> 1) & 0x7fff;
        uVar15 = (ulong)uVar22;
        iVar20 = iVar20 + 1;
      } while (iVar20 != 0);
      crc16tbl[0][uVar16] = (uint16_t)uVar22;
      uVar16 = uVar16 + 1;
    } while (uVar16 != 0x100);
    lVar17 = -0x200;
    do {
      uVar18 = *(ushort *)((long)crc16tbl[1] + lVar17);
      *(ushort *)((long)&archive_read_format_tar_read_header::default_inode + lVar17) =
           uVar18 >> 8 ^ crc16tbl[0][(byte)uVar18];
      lVar17 = lVar17 + 2;
    } while (lVar17 != 0);
  }
  (a->archive).archive_format = 0xb0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "lha";
  }
  lha = (lha *)a->format->data;
  lha->decompress_init = '\0';
  lha->end_of_entry = '\0';
  lha->end_of_entry_cleanup = '\0';
  lha->entry_unconsumed = 0;
  pcVar8 = (char *)__archive_read_ahead(a,0x16,(ssize_t *)0x0);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
    if (pcVar8 == (char *)0x0) {
      return L'\x01';
    }
    if (*pcVar8 == '\0') {
      return L'\x01';
    }
  }
  else {
    if (((lha->found_first_header == '\0') && (*pcVar8 == 'M')) && (pcVar8[1] == 'Z')) {
      uVar16 = 0x1000;
      do {
        while (pvVar9 = __archive_read_ahead(a,uVar16,(ssize_t *)&local_98), pvVar9 != (void *)0x0)
        {
          if ((long)local_98.aes_mbs.s < 0x16) goto LAB_00121ac0;
          pvVar21 = pvVar9;
          if (local_98.aes_mbs.s != (char *)0x16) {
            pcVar8 = local_98.aes_mbs.s + (long)pvVar9;
            h = pvVar9;
            do {
              sVar10 = lha_check_header_format(h);
              if (sVar10 == 0) {
                __archive_read_consume(a,(long)h - (long)pvVar9);
                bVar24 = false;
                wVar6 = L'\0';
                goto LAB_00121b20;
              }
              pvVar21 = (void *)((long)h + sVar10);
              pcVar11 = (char *)((long)h + sVar10 + 0x16);
              h = pvVar21;
            } while (pcVar11 < pcVar8);
          }
          __archive_read_consume(a,(long)pvVar21 - (long)pvVar9);
        }
        bVar24 = 0x31 < uVar16;
        uVar16 = uVar16 >> 1;
      } while (bVar24);
LAB_00121ac0:
      archive_set_error(&a->archive,0x54,"Couldn\'t find out LHa header");
      wVar6 = L'\xffffffe2';
      bVar24 = true;
LAB_00121b20:
      if (bVar24) {
        return wVar6;
      }
      pcVar8 = (char *)__archive_read_ahead(a,1,(ssize_t *)0x0);
      if (pcVar8 == (char *)0x0) goto LAB_00121b05;
    }
    if (*pcVar8 == '\0') {
      return L'\x01';
    }
    sVar10 = lha_check_header_format(pcVar8);
    if (sVar10 != 0) {
      pcVar8 = "Bad LHa file";
      goto LAB_00121b5f;
    }
    lha->found_first_header = '\x01';
    lha->header_size = 0;
    lha->level = pcVar8[0x14];
    lha->method[0] = pcVar8[3];
    lha->method[1] = pcVar8[4];
    cVar1 = pcVar8[5];
    lha->method[2] = cVar1;
    uVar18 = *(ushort *)lha->method ^ 0x686c;
    lha->directory = cVar1 == 'd' && uVar18 == 0;
    if (cVar1 == '0' && uVar18 == 0) {
      bVar24 = false;
    }
    else {
      bVar24 = lha->method[2] != '4' || *(short *)lha->method != 0x7a6c;
    }
    lha->entry_is_compressed = bVar24;
    lha->birthtime = 0;
    lha->birthtime_tv_nsec = 0;
    lha->mtime = 0;
    lha->mtime_tv_nsec = 0;
    lha->atime = 0;
    lha->atime_tv_nsec = 0;
    lha->compsize = 0;
    lha->origsize = 0;
    lha->setflag = 0;
    mVar19 = 0x1ff;
    if (lha->directory == '\0') {
      mVar19 = 0x1b6;
    }
    lha->mode = mVar19;
    (lha->dirname).length = 0;
    (lha->filename).length = 0;
    lha->dos_attr = '\0';
    lha->uid = 0;
    lha->gid = 0;
    paVar3 = lha->opt_sconv;
    if (paVar3 == (archive_string_conv *)0x0) {
      lha->sconv_dir = (archive_string_conv *)0x0;
      lha->sconv_fname = (archive_string_conv *)0x0;
    }
    else {
      lha->sconv_dir = paVar3;
      lha->sconv_fname = paVar3;
    }
    if ((byte)pcVar8[0x14] < 4) {
      switch(pcVar8[0x14]) {
      case '\0':
        pbVar13 = (byte *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
        if (pbVar13 == (byte *)0x0) {
LAB_00121ffc:
          pcVar11 = "Truncated LHa header";
          goto LAB_00122003;
        }
        lha->header_size = (ulong)*pbVar13 + 2;
        bVar2 = pbVar13[1];
        lha->compsize = (ulong)*(uint *)(pbVar13 + 7);
        lha->origsize = (ulong)*(uint *)(pbVar13 + 0xb);
        iVar14 = dos_to_unix(*(uint32_t *)(pbVar13 + 0xf));
        lha->mtime = iVar14;
        bVar23 = pbVar13[0x15];
        uVar16 = (ulong)bVar23;
        iVar20 = ((int)lha->header_size - (uint)bVar23) + -0x18;
        if (iVar20 != -2 && (iVar20 < 0 || 0xdd < bVar23)) goto LAB_001221ca;
        pvVar9 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
        if (pvVar9 == (void *)0x0) {
LAB_001220f1:
          pcVar11 = "Truncated LHa header";
          goto LAB_001221d1;
        }
        (lha->filename).length = 0;
        archive_strncat(&lha->filename,(void *)((long)pvVar9 + 0x16),uVar16);
        if (-1 < iVar20) {
          lha->crc = *(uint16_t *)((long)pvVar9 + 0x16 + uVar16);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
        }
        sVar10 = lha->header_size;
        if (sVar10 == 2) {
          bVar23 = 0;
        }
        else {
          sVar12 = 2;
          bVar23 = 0;
          do {
            bVar23 = bVar23 + *(char *)((long)pvVar9 + sVar12);
            sVar12 = sVar12 + 1;
          } while (sVar10 != sVar12);
        }
        if (((0 < iVar20) && (*(char *)((long)pvVar9 + uVar16 + 0x18) == 'U')) && (iVar20 == 0xc)) {
          lha->mtime = (ulong)*(uint *)((long)pvVar9 + uVar16 + 0x1a);
          lha->mode = (uint)*(ushort *)((long)pvVar9 + uVar16 + 0x1e);
          lha->uid = (ulong)*(ushort *)((long)pvVar9 + uVar16 + 0x20);
          lha->gid = (ulong)*(ushort *)((long)pvVar9 + uVar16 + 0x22);
          *(byte *)&lha->setflag = (byte)lha->setflag | 4;
        }
        __archive_read_consume(a,sVar10);
        wVar6 = L'\0';
        if (bVar23 == bVar2) goto LAB_001221ea;
        pcVar11 = "LHa header sum error";
        iVar20 = -1;
        break;
      case '\x01':
        pbVar13 = (byte *)__archive_read_ahead(a,0x1b,(ssize_t *)0x0);
        if (pbVar13 == (byte *)0x0) goto LAB_00121ffc;
        lha->header_size = (ulong)*pbVar13 + 2;
        bVar2 = pbVar13[1];
        lha->compsize = (ulong)*(uint *)(pbVar13 + 7);
        lha->origsize = (ulong)*(uint *)(pbVar13 + 0xb);
        iVar14 = dos_to_unix(*(uint32_t *)(pbVar13 + 0xf));
        lha->mtime = iVar14;
        bVar23 = pbVar13[0x15];
        uVar16 = (ulong)bVar23;
        if ((bVar23 < 0xe7) && ((int)(uint)bVar23 <= (int)lha->header_size + -0x1b)) {
          pvVar9 = __archive_read_ahead(a,lha->header_size,(ssize_t *)0x0);
          if (pvVar9 == (void *)0x0) goto LAB_001220f1;
          pvVar21 = (void *)((long)pvVar9 + 0x16);
          if (uVar16 != 0) {
            uVar15 = 0;
            do {
              if (*(char *)((long)pvVar21 + uVar15) == -1) goto LAB_001221ca;
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
          (lha->filename).length = 0;
          archive_strncat(&lha->filename,pvVar21,uVar16);
          lha->crc = *(uint16_t *)((long)pvVar21 + uVar16);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
          lVar17 = lha->header_size - 2;
          if (lVar17 == 0) {
            bVar23 = 0;
          }
          else {
            sVar10 = 2;
            bVar23 = 0;
            do {
              bVar23 = bVar23 + *(char *)((long)pvVar9 + sVar10);
              sVar10 = sVar10 + 1;
            } while (lha->header_size != sVar10);
          }
          __archive_read_consume(a,lVar17);
          wVar6 = lha_read_file_extended_header
                            (a,lha,(uint16_t *)0x0,L'\x02',lha->compsize + 2,(size_t *)&local_98);
          if (L'\xffffffeb' < wVar6) {
            lVar17 = (lha->compsize - (long)local_98.aes_mbs.s) + 2;
            lha->compsize = lVar17;
            if (lVar17 < 0) goto LAB_001221ca;
            if (bVar23 != bVar2) {
              pcVar11 = "LHa header sum error";
              iVar20 = -1;
              goto LAB_001221d9;
            }
            wVar6 = wVar6 & wVar6 >> 0x1f;
          }
        }
        else {
LAB_001221ca:
          pcVar11 = "Invalid LHa header";
LAB_001221d1:
          iVar20 = 0x54;
LAB_001221d9:
          archive_set_error(&a->archive,iVar20,pcVar11);
          wVar6 = L'\xffffffe2';
        }
        goto LAB_001221ea;
      case '\x02':
        pp = (ushort *)__archive_read_ahead(a,0x18,(ssize_t *)0x0);
        pcVar11 = "Truncated LHa header";
        if (pp != (ushort *)0x0) {
          uVar18 = *pp;
          lha->header_size = (ulong)uVar18;
          lha->compsize = (ulong)*(uint *)((long)pp + 7);
          lha->origsize = (ulong)*(uint *)((long)pp + 0xb);
          lha->mtime = (ulong)*(uint *)((long)pp + 0xf);
          lha->crc = *(uint16_t *)((long)pp + 0x15);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
          if ((ulong)uVar18 < 0x18) {
            pcVar11 = "Invalid LHa header size";
          }
          else {
            uVar4 = lha_crc16(0,pp,0x18);
            local_d8.s = (wchar_t *)CONCAT62(local_d8.s._2_6_,uVar4);
            __archive_read_consume(a,0x18);
            wVar6 = lha_read_file_extended_header
                              (a,lha,(uint16_t *)&local_d8,L'\x02',lha->header_size - 0x18,
                               (size_t *)&local_98);
            if (wVar6 < L'\xffffffec') goto LAB_001221ea;
            uVar22 = ((int)lha->header_size - (int)local_98.aes_mbs.s) - 0x18;
            if (0 < (int)uVar22) {
              uVar16 = (ulong)uVar22;
              pvVar9 = __archive_read_ahead(a,uVar16,(ssize_t *)0x0);
              if (pvVar9 == (void *)0x0) goto LAB_00121e06;
              uVar4 = lha_crc16((uint16_t)local_d8.s,pvVar9,uVar16);
              local_d8.s = (wchar_t *)CONCAT62(local_d8.s._2_6_,uVar4);
              __archive_read_consume(a,uVar16);
            }
            if ((uint16_t)local_d8.s == lha->header_crc) goto LAB_001221ea;
            pcVar11 = "LHa header CRC error";
          }
        }
LAB_00121e06:
        archive_set_error(&a->archive,0x54,pcVar11);
        wVar6 = L'\xffffffe2';
        goto LAB_001221ea;
      case '\x03':
        pp_00 = (short *)__archive_read_ahead(a,0x1c,(ssize_t *)0x0);
        if (pp_00 == (short *)0x0) goto LAB_00121ffc;
        pcVar11 = "Invalid LHa header";
        if (*pp_00 == 4) {
          uVar22 = *(uint *)(pp_00 + 0xc);
          lha->header_size = (ulong)uVar22;
          lha->compsize = (ulong)*(uint *)((long)pp_00 + 7);
          lha->origsize = (ulong)*(uint *)((long)pp_00 + 0xb);
          lha->mtime = (ulong)*(uint *)((long)pp_00 + 0xf);
          lha->crc = *(uint16_t *)((long)pp_00 + 0x15);
          *(byte *)&lha->setflag = (byte)lha->setflag | 8;
          if (0x1f < (ulong)uVar22) {
            uVar4 = lha_crc16(0,pp_00,0x1c);
            local_d8.s = (wchar_t *)CONCAT62(local_d8.s._2_6_,uVar4);
            __archive_read_consume(a,0x1c);
            wVar6 = lha_read_file_extended_header
                              (a,lha,(uint16_t *)&local_d8,L'\x04',lha->header_size - 0x1c,
                               (size_t *)&local_98);
            if ((wVar6 < L'\xffffffec') || ((uint16_t)local_d8.s == lha->header_crc))
            goto LAB_001221ea;
            pcVar11 = "LHa header CRC error";
          }
        }
LAB_00122003:
        iVar20 = 0x54;
      }
      archive_set_error(&a->archive,iVar20,pcVar11);
    }
    else {
      archive_set_error(&a->archive,0x54,"Unsupported LHa header level %d");
    }
    wVar6 = L'\xffffffe2';
LAB_001221ea:
    if (wVar6 < L'\xffffffec') {
      return wVar6;
    }
    if ((lha->directory != '\0') || ((lha->filename).length != 0)) {
      local_b8.s = (wchar_t *)0x0;
      local_b8.length = 0;
      local_b8.buffer_length = 0;
      local_d8.s = (wchar_t *)0x0;
      local_d8.length = 0;
      local_d8.buffer_length = 0;
      local_98.aes_mbs.s = (char *)0x0;
      local_98.aes_mbs.length = 0;
      local_98.aes_mbs.buffer_length = 0;
      local_98.aes_utf8.s = (char *)0x0;
      local_98.aes_utf8.length = 0;
      local_98.aes_utf8.buffer_length = 0;
      local_98.aes_wcs.s = (wchar_t *)0x0;
      local_98.aes_wcs.length = 0;
      local_98.aes_wcs.buffer_length = 0;
      local_98.aes_mbs_in_locale.s = (char *)0x0;
      local_98.aes_mbs_in_locale.length = 0;
      local_98.aes_mbs_in_locale.buffer_length = 0;
      wVar5 = archive_mstring_copy_mbs_len_l
                        (&local_98,(lha->dirname).s,(lha->dirname).length,lha->sconv_dir);
      if (wVar5 == L'\0') {
        wVar7 = archive_mstring_get_wcs(&a->archive,&local_98,&local_a0);
        wVar5 = L'\xffffffe2';
        if (wVar7 == L'\0') {
          wVar5 = wVar6;
        }
      }
      else {
        pcVar11 = archive_string_conversion_charset_name(lha->sconv_dir);
        archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to Unicode.",
                          pcVar11);
        wVar5 = L'\xffffffe2';
      }
      if (wVar5 == L'\xffffffe2') {
LAB_00122364:
        archive_mstring_clean(&local_98);
        archive_wstring_free(&local_b8);
        archive_wstring_free(&local_d8);
        return L'\xffffffe2';
      }
      local_b8.length = 0;
      archive_wstring_concat(&local_b8,&local_98.aes_wcs);
      local_98.aes_mbs.length = 0;
      local_98.aes_mbs_in_locale.length = 0;
      local_98.aes_utf8.length = 0;
      local_98.aes_wcs.length = 0;
      wVar6 = archive_mstring_copy_mbs_len_l
                        (&local_98,(lha->filename).s,(lha->filename).length,lha->sconv_fname);
      if (wVar6 == L'\0') {
        wVar7 = archive_mstring_get_wcs(&a->archive,&local_98,&local_a0);
        wVar6 = L'\xffffffe2';
        if (wVar7 == L'\0') {
          wVar6 = wVar5;
        }
      }
      else {
        pcVar11 = archive_string_conversion_charset_name(lha->sconv_fname);
        archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to Unicode.",
                          pcVar11);
        wVar6 = L'\xffffffe2';
      }
      if (wVar6 == L'\xffffffe2') goto LAB_00122364;
      archive_wstring_concat(&local_b8,&local_98.aes_wcs);
      archive_mstring_clean(&local_98);
      if ((lha->mode & 0xf000) == 0xa000) {
        wVar5 = lha_parse_linkname(&local_d8,&local_b8);
        if (wVar5 == L'\0') {
          archive_set_error(&a->archive,0x54,"Unknown symlink-name");
          archive_wstring_free(&local_b8);
          archive_wstring_free(&local_d8);
          return L'\xffffffe7';
        }
      }
      else {
        lha->mode = (lha->mode & 0xffff0fff) + (uint)(lha->directory == '\0') * 0x4000 + 0x4000;
      }
      if (((lha->setflag & 4) == 0) && ((lha->dos_attr & 1) != 0)) {
        *(byte *)&lha->mode = (byte)lha->mode & 0x6d;
      }
      archive_entry_copy_pathname_w(entry,local_b8.s);
      archive_wstring_free(&local_b8);
      if (local_d8.length == 0) {
        archive_entry_set_symlink(entry,(char *)0x0);
      }
      else {
        archive_entry_copy_symlink_w(entry,local_d8.s);
      }
      archive_wstring_free(&local_d8);
      if (pcVar8[0x14] == '\0') {
        lha_replace_path_separator(lha,entry);
      }
      archive_entry_set_mode(entry,lha->mode);
      archive_entry_set_uid(entry,lha->uid);
      archive_entry_set_gid(entry,lha->gid);
      if ((lha->uname).length != 0) {
        archive_entry_set_uname(entry,(lha->uname).s);
      }
      if ((lha->gname).length != 0) {
        archive_entry_set_gname(entry,(lha->gname).s);
      }
      if ((lha->setflag & 1) == 0) {
        archive_entry_unset_birthtime(entry);
        archive_entry_unset_ctime(entry);
      }
      else {
        archive_entry_set_birthtime(entry,lha->birthtime,(ulong)lha->birthtime_tv_nsec);
        archive_entry_set_ctime(entry,lha->birthtime,(ulong)lha->birthtime_tv_nsec);
      }
      archive_entry_set_mtime(entry,lha->mtime,(ulong)lha->mtime_tv_nsec);
      if ((lha->setflag & 2) == 0) {
        archive_entry_unset_atime(entry);
      }
      else {
        archive_entry_set_atime(entry,lha->atime,(ulong)lha->atime_tv_nsec);
      }
      if ((lha->directory == '\0') && (pcVar8 = archive_entry_symlink(entry), pcVar8 == (char *)0x0)
         ) {
        archive_entry_set_size(entry,lha->origsize);
      }
      else {
        archive_entry_unset_size(entry);
      }
      lVar17 = lha->compsize;
      lha->entry_bytes_remaining = lVar17;
      if (-1 < lVar17) {
        lha->entry_offset = 0;
        lha->entry_crc_calculated = 0;
        if ((lVar17 == 0) || (lha->directory != '\0')) {
          lha->end_of_entry = '\x01';
        }
        snprintf(lha->format_name,0x40,"lha -%c%c%c-",(ulong)(uint)(int)lha->method[0],
                 (ulong)(uint)(int)lha->method[1],(ulong)(uint)(int)lha->method[2]);
        (a->archive).archive_format_name = lha->format_name;
        return wVar6;
      }
      pcVar8 = "Invalid LHa entry size";
      goto LAB_00121b5f;
    }
  }
LAB_00121b05:
  pcVar8 = "Truncated LHa header";
LAB_00121b5f:
  archive_set_error(&a->archive,0x54,pcVar8);
  return L'\xffffffe2';
}

Assistant:

static int
archive_read_format_lha_read_header(struct archive_read *a,
    struct archive_entry *entry)
{
	struct archive_wstring linkname;
	struct archive_wstring pathname;
	struct lha *lha;
	const unsigned char *p;
	const char *signature;
	int err;
	struct archive_mstring conv_buffer;
	const wchar_t *conv_buffer_p;

	lha_crc16_init();

	a->archive.archive_format = ARCHIVE_FORMAT_LHA;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "lha";

	lha = (struct lha *)(a->format->data);
	lha->decompress_init = 0;
	lha->end_of_entry = 0;
	lha->end_of_entry_cleanup = 0;
	lha->entry_unconsumed = 0;

	if ((p = __archive_read_ahead(a, H_SIZE, NULL)) == NULL) {
		/*
		 * LHa archiver added 0 to the tail of its archive file as
		 * the mark of the end of the archive.
		 */
		signature = __archive_read_ahead(a, sizeof(signature[0]), NULL);
		if (signature == NULL || signature[0] == 0)
			return (ARCHIVE_EOF);
		return (truncated_error(a));
	}

	signature = (const char *)p;
	if (lha->found_first_header == 0 &&
	    signature[0] == 'M' && signature[1] == 'Z') {
                /* This is an executable?  Must be self-extracting... 	*/
		err = lha_skip_sfx(a);
		if (err < ARCHIVE_WARN)
			return (err);

		if ((p = __archive_read_ahead(a, sizeof(*p), NULL)) == NULL)
			return (truncated_error(a));
		signature = (const char *)p;
	}
	/* signature[0] == 0 means the end of an LHa archive file. */
	if (signature[0] == 0)
		return (ARCHIVE_EOF);

	/*
	 * Check the header format and method type.
	 */
	if (lha_check_header_format(p) != 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Bad LHa file");
		return (ARCHIVE_FATAL);
	}

	/* We've found the first header. */
	lha->found_first_header = 1;
	/* Set a default value and common data */
	lha->header_size = 0;
	lha->level = p[H_LEVEL_OFFSET];
	lha->method[0] = p[H_METHOD_OFFSET+1];
	lha->method[1] = p[H_METHOD_OFFSET+2];
	lha->method[2] = p[H_METHOD_OFFSET+3];
	if (memcmp(lha->method, "lhd", 3) == 0)
		lha->directory = 1;
	else
		lha->directory = 0;
	if (memcmp(lha->method, "lh0", 3) == 0 ||
	    memcmp(lha->method, "lz4", 3) == 0)
		lha->entry_is_compressed = 0;
	else
		lha->entry_is_compressed = 1;

	lha->compsize = 0;
	lha->origsize = 0;
	lha->setflag = 0;
	lha->birthtime = 0;
	lha->birthtime_tv_nsec = 0;
	lha->mtime = 0;
	lha->mtime_tv_nsec = 0;
	lha->atime = 0;
	lha->atime_tv_nsec = 0;
	lha->mode = (lha->directory)? 0777 : 0666;
	lha->uid = 0;
	lha->gid = 0;
	archive_string_empty(&lha->dirname);
	archive_string_empty(&lha->filename);
	lha->dos_attr = 0;
	if (lha->opt_sconv != NULL) {
		lha->sconv_dir = lha->opt_sconv;
		lha->sconv_fname = lha->opt_sconv;
	} else {
		lha->sconv_dir = NULL;
		lha->sconv_fname = NULL;
	}

	switch (p[H_LEVEL_OFFSET]) {
	case 0:
		err = lha_read_file_header_0(a, lha);
		break;
	case 1:
		err = lha_read_file_header_1(a, lha);
		break;
	case 2:
		err = lha_read_file_header_2(a, lha);
		break;
	case 3:
		err = lha_read_file_header_3(a, lha);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported LHa header level %d", p[H_LEVEL_OFFSET]);
		err = ARCHIVE_FATAL;
		break;
	}
	if (err < ARCHIVE_WARN)
		return (err);


	if (!lha->directory && archive_strlen(&lha->filename) == 0)
		/* The filename has not been set */
		return (truncated_error(a));

	/*
	 * Make a pathname from a dirname and a filename, after converting to Unicode.
	 * This is because codepages might differ between dirname and filename.
	*/
	archive_string_init(&pathname);
	archive_string_init(&linkname);
	archive_string_init(&conv_buffer.aes_mbs);
	archive_string_init(&conv_buffer.aes_mbs_in_locale);
	archive_string_init(&conv_buffer.aes_utf8);
	archive_string_init(&conv_buffer.aes_wcs);
	if (0 != archive_mstring_copy_mbs_len_l(&conv_buffer, lha->dirname.s, lha->dirname.length, lha->sconv_dir)) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_FILE_FORMAT,
			"Pathname cannot be converted "
			"from %s to Unicode.",
			archive_string_conversion_charset_name(lha->sconv_dir));
		err = ARCHIVE_FATAL;
	} else if (0 != archive_mstring_get_wcs(&a->archive, &conv_buffer, &conv_buffer_p))
		err = ARCHIVE_FATAL;
	if (err == ARCHIVE_FATAL) {
		archive_mstring_clean(&conv_buffer);
		archive_wstring_free(&pathname);
		archive_wstring_free(&linkname);
		return (err);
	}
	archive_wstring_copy(&pathname, &conv_buffer.aes_wcs);

	archive_string_empty(&conv_buffer.aes_mbs);
	archive_string_empty(&conv_buffer.aes_mbs_in_locale);
	archive_string_empty(&conv_buffer.aes_utf8);
	archive_wstring_empty(&conv_buffer.aes_wcs);
	if (0 != archive_mstring_copy_mbs_len_l(&conv_buffer, lha->filename.s, lha->filename.length, lha->sconv_fname)) {
		archive_set_error(&a->archive,
			ARCHIVE_ERRNO_FILE_FORMAT,
			"Pathname cannot be converted "
			"from %s to Unicode.",
			archive_string_conversion_charset_name(lha->sconv_fname));
		err = ARCHIVE_FATAL;
	}
	else if (0 != archive_mstring_get_wcs(&a->archive, &conv_buffer, &conv_buffer_p))
		err = ARCHIVE_FATAL;
	if (err == ARCHIVE_FATAL) {
		archive_mstring_clean(&conv_buffer);
		archive_wstring_free(&pathname);
		archive_wstring_free(&linkname);
		return (err);
	}
	archive_wstring_concat(&pathname, &conv_buffer.aes_wcs);
	archive_mstring_clean(&conv_buffer);

	if ((lha->mode & AE_IFMT) == AE_IFLNK) {
		/*
	 	 * Extract the symlink-name if it's included in the pathname.
	 	 */
		if (!lha_parse_linkname(&linkname, &pathname)) {
			/* We couldn't get the symlink-name. */
			archive_set_error(&a->archive,
		    	    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unknown symlink-name");
			archive_wstring_free(&pathname);
			archive_wstring_free(&linkname);
			return (ARCHIVE_FAILED);
		}
	} else {
		/*
		 * Make sure a file-type is set.
		 * The mode has been overridden if it is in the extended data.
		 */
		lha->mode = (lha->mode & ~AE_IFMT) |
		    ((lha->directory)? AE_IFDIR: AE_IFREG);
	}
	if ((lha->setflag & UNIX_MODE_IS_SET) == 0 &&
	    (lha->dos_attr & 1) != 0)
		lha->mode &= ~(0222);/* read only. */

	/*
	 * Set basic file parameters.
	 */
	archive_entry_copy_pathname_w(entry, pathname.s);
	archive_wstring_free(&pathname);
	if (archive_strlen(&linkname) > 0) {
		archive_entry_copy_symlink_w(entry, linkname.s);
	} else
		archive_entry_set_symlink(entry, NULL);
	archive_wstring_free(&linkname);
	/*
	 * When a header level is 0, there is a possibility that
	 * a pathname and a symlink has '\' character, a directory
	 * separator in DOS/Windows. So we should convert it to '/'.
	 */
	if (p[H_LEVEL_OFFSET] == 0)
		lha_replace_path_separator(lha, entry);

	archive_entry_set_mode(entry, lha->mode);
	archive_entry_set_uid(entry, lha->uid);
	archive_entry_set_gid(entry, lha->gid);
	if (archive_strlen(&lha->uname) > 0)
		archive_entry_set_uname(entry, lha->uname.s);
	if (archive_strlen(&lha->gname) > 0)
		archive_entry_set_gname(entry, lha->gname.s);
	if (lha->setflag & BIRTHTIME_IS_SET) {
		archive_entry_set_birthtime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
		archive_entry_set_ctime(entry, lha->birthtime,
		    lha->birthtime_tv_nsec);
	} else {
		archive_entry_unset_birthtime(entry);
		archive_entry_unset_ctime(entry);
	}
	archive_entry_set_mtime(entry, lha->mtime, lha->mtime_tv_nsec);
	if (lha->setflag & ATIME_IS_SET)
		archive_entry_set_atime(entry, lha->atime,
		    lha->atime_tv_nsec);
	else
		archive_entry_unset_atime(entry);
	if (lha->directory || archive_entry_symlink(entry) != NULL)
		archive_entry_unset_size(entry);
	else
		archive_entry_set_size(entry, lha->origsize);

	/*
	 * Prepare variables used to read a file content.
	 */
	lha->entry_bytes_remaining = lha->compsize;
	if (lha->entry_bytes_remaining < 0) {
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Invalid LHa entry size");
		return (ARCHIVE_FATAL);
	}
	lha->entry_offset = 0;
	lha->entry_crc_calculated = 0;

	/*
	 * This file does not have a content.
	 */
	if (lha->directory || lha->compsize == 0)
		lha->end_of_entry = 1;

	snprintf(lha->format_name, sizeof(lha->format_name), "lha -%c%c%c-",
	    lha->method[0], lha->method[1], lha->method[2]);
	a->archive.archive_format_name = lha->format_name;

	return (err);
}